

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

Instr * __thiscall Lowerer::LowerCheckWasmSignature(Lowerer *this,Instr *instr)

{
  LowererMD *this_00;
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  OpndKind OVar4;
  uint index;
  JITTimeFunctionBody *pJVar5;
  undefined4 *puVar6;
  IntConstOpnd *pIVar7;
  RegOpnd *pRVar8;
  IndirOpnd *pIVar9;
  AsmJsJITInfo *pAVar10;
  WasmSignature *this_01;
  size_t sVar11;
  LabelInstr *target;
  LabelInstr *target_00;
  Lowerer *this_02;
  Opnd *errorCode;
  intptr_t address;
  AddrOpnd *opndArg;
  
  pJVar5 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  bVar3 = JITTimeFunctionBody::IsWasmFunction(pJVar5);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2165,"(m_func->GetJITFunctionBody()->IsWasmFunction())",
                       "m_func->GetJITFunctionBody()->IsWasmFunction()");
    if (!bVar3) goto LAB_005b8534;
    *puVar6 = 0;
  }
  if (instr->m_src1 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2166,"(instr->GetSrc1())","instr->GetSrc1()");
    if (!bVar3) goto LAB_005b8534;
    *puVar6 = 0;
  }
  OVar4 = IR::Opnd::GetKind(instr->m_src2);
  if (OVar4 != OpndKindIntConst) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2167,"(instr->GetSrc2()->IsIntConstOpnd())",
                       "instr->GetSrc2()->IsIntConstOpnd()");
    if (!bVar3) goto LAB_005b8534;
    *puVar6 = 0;
  }
  pIVar7 = (IntConstOpnd *)IR::Instr::UnlinkSrc2(instr);
  OVar4 = IR::Opnd::GetKind((Opnd *)pIVar7);
  if (OVar4 != OpndKindIntConst) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
    if (!bVar3) goto LAB_005b8534;
    *puVar6 = 0;
  }
  index = IR::IntConstOpnd::AsInt32(pIVar7);
  pIVar1 = instr->m_prev;
  pRVar8 = (RegOpnd *)IR::Instr::UnlinkSrc1(instr);
  OVar4 = IR::Opnd::GetKind((Opnd *)pRVar8);
  if (OVar4 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) {
LAB_005b8534:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  pIVar9 = IR::IndirOpnd::New(pRVar8,0x50,TyInt64,this->m_func,false);
  pJVar5 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  pAVar10 = JITTimeFunctionBody::GetAsmJsInfo(pJVar5);
  this_01 = AsmJsJITInfo::GetWasmSignature(pAVar10,index);
  sVar11 = Wasm::WasmSignature::GetShortSig(this_01);
  if (sVar11 == 0xffffffffffffffff) {
    pJVar5 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    pAVar10 = JITTimeFunctionBody::GetAsmJsInfo(pJVar5);
    address = AsmJsJITInfo::GetWasmSignatureAddr(pAVar10,index);
    opndArg = IR::AddrOpnd::New(address,AddrOpndKindConstantAddress,this->m_func,false,(Var)0x0);
    this_00 = &this->m_lowererMD;
    LowererMD::LoadHelperArgument(this_00,instr,&opndArg->super_Opnd);
    LowererMD::LoadHelperArgument(this_00,instr,&pIVar9->super_Opnd);
    LoadScriptContext(this,instr);
    LowererMD::ChangeToHelperCall
              (this_00,instr,HelperOp_CheckWasmSignature,(LabelInstr *)0x0,(Opnd *)0x0,
               (PropertySymOpnd *)0x0,false);
  }
  else {
    target = IR::LabelInstr::New(Label,instr->m_func,true);
    IR::Instr::InsertBefore(instr,&target->super_Instr);
    target_00 = InsertLabel(false,instr->m_next);
    pRVar8 = IR::RegOpnd::New(TyInt64,this->m_func);
    InsertMove(&pRVar8->super_Opnd,&pIVar9->super_Opnd,&target->super_Instr,true);
    pIVar9 = IR::IndirOpnd::New(pRVar8,0x10,TyInt64,this->m_func,false);
    this_02 = (Lowerer *)Wasm::WasmSignature::GetShortSig(this_01);
    pIVar7 = IR::IntConstOpnd::New((IntConstType)this_02,TyInt64,this->m_func,false);
    InsertCompareBranch(this_02,&pIVar9->super_Opnd,&pIVar7->super_Opnd,BrNeq_A,false,target,
                        &target->super_Instr,false);
    InsertBranch(Br,false,target_00,&target->super_Instr);
    errorCode = IR::IntConstOpnd::NewFromType(0x1b66,TyInt32,this->m_func);
    GenerateThrow(this,errorCode,instr);
    IR::Instr::Remove(instr);
  }
  return pIVar1;
}

Assistant:

IR::Instr *
Lowerer::LowerCheckWasmSignature(IR::Instr * instr)
{
    Assert(m_func->GetJITFunctionBody()->IsWasmFunction());
    Assert(instr->GetSrc1());
    Assert(instr->GetSrc2()->IsIntConstOpnd());

    int sigId = instr->UnlinkSrc2()->AsIntConstOpnd()->AsInt32();

    IR::Instr *instrPrev = instr->m_prev;

    IR::IndirOpnd * actualSig = IR::IndirOpnd::New(instr->UnlinkSrc1()->AsRegOpnd(), Js::WasmScriptFunction::GetOffsetOfSignature(), TyMachReg, m_func);

    Wasm::WasmSignature * expectedSig = m_func->GetJITFunctionBody()->GetAsmJsInfo()->GetWasmSignature(sigId);
    if (expectedSig->GetShortSig() == Js::Constants::InvalidSignature)
    {
        intptr_t sigAddr = m_func->GetJITFunctionBody()->GetAsmJsInfo()->GetWasmSignatureAddr(sigId);
        IR::AddrOpnd * expectedOpnd = IR::AddrOpnd::New(sigAddr, IR::AddrOpndKindConstantAddress, m_func);
        m_lowererMD.LoadHelperArgument(instr, expectedOpnd);
        m_lowererMD.LoadHelperArgument(instr, actualSig);

        LoadScriptContext(instr);

        m_lowererMD.ChangeToHelperCall(instr, IR::HelperOp_CheckWasmSignature);
    }
    else
    {
        IR::LabelInstr * trapLabel = InsertLabel(true, instr);
        IR::LabelInstr * labelFallThrough = InsertLabel(false, instr->m_next);
        IR::RegOpnd * actualRegOpnd = IR::RegOpnd::New(TyMachReg, m_func);
        InsertMove(actualRegOpnd, actualSig, trapLabel);

        IR::IndirOpnd * shortSigIndir = IR::IndirOpnd::New(actualRegOpnd, Wasm::WasmSignature::GetOffsetOfShortSig(), TyMachReg, m_func);
        InsertCompareBranch(shortSigIndir, IR::IntConstOpnd::New(expectedSig->GetShortSig(), TyMachReg, m_func), Js::OpCode::BrNeq_A, trapLabel, trapLabel);

        InsertBranch(Js::OpCode::Br, labelFallThrough, trapLabel);

        GenerateThrow(IR::IntConstOpnd::NewFromType(SCODE_CODE(WASMERR_SignatureMismatch), TyInt32, m_func), instr);

        instr->Remove();

    }


    return instrPrev;
}